

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_layer.c
# Opt level: O0

void branch_layer_forward(layer_t *l)

{
  long lVar1;
  layer_t *branch;
  branch_layer_t *me;
  int b;
  int i;
  layer_t *l_local;
  
  for (me._4_4_ = 0; me._4_4_ < *(int *)&l[1].func; me._4_4_ = me._4_4_ + 1) {
    lVar1 = *(long *)**(undefined8 **)(l[1].in.val + (long)me._4_4_ * 4 + 2);
    for (me._0_4_ = 0; (int)me < l->n->batch; me._0_4_ = (int)me + 1) {
      memcpy((void *)(*(long *)(lVar1 + 8) + (long)((int)me * *(int *)(lVar1 + 0x28)) * 4),
             (l->in).val + ((int)me * (l->in).size + (int)l[1].in.val[(long)me._4_4_ * 4]),
             (long)*(int *)(lVar1 + 0x28) << 2);
    }
    net_forward(*(net_t **)(l[1].in.val + (long)me._4_4_ * 4 + 2));
  }
  return;
}

Assistant:

static void branch_layer_forward(layer_t *l)
{
    int i = 0, b = 0;
    branch_layer_t *me = (branch_layer_t *)l;

    for (i = 0; i < me->num; ++i)
    {
        layer_t *branch = me->branch[i].n->layer[0];
        for (b = 0; b < l->n->batch; ++b)
            memcpy(&branch->in.val[b * branch->in.size], &l->in.val[b * l->in.size + me->branch[i].offset],
                   branch->in.size * sizeof(data_val_t));

        net_forward(me->branch[i].n);
    }
}